

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O1

inputs_t allocateInputs(picnic_instance_t *params)

{
  byte bVar1;
  inputs_t ppuVar2;
  inputs_t ppuVar3;
  inputs_t ppuVar4;
  ulong uVar5;
  
  uVar5 = (ulong)params->num_rounds;
  bVar1 = params->input_output_size;
  ppuVar2 = (inputs_t)calloc(1,((ulong)bVar1 + 8) * uVar5);
  if (uVar5 != 0) {
    ppuVar3 = ppuVar2 + uVar5;
    ppuVar4 = ppuVar2;
    do {
      *ppuVar4 = (uint8_t *)ppuVar3;
      ppuVar3 = (inputs_t)((long)ppuVar3 + (ulong)bVar1);
      ppuVar4 = ppuVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return ppuVar2;
}

Assistant:

inputs_t allocateInputs(const picnic_instance_t* params) {
  uint8_t* slab = calloc(1, params->num_rounds * (params->input_output_size + sizeof(uint8_t*)));

  inputs_t inputs = (uint8_t**)slab;

  slab += params->num_rounds * sizeof(uint8_t*);

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    inputs[i] = (uint8_t*)slab;
    slab += params->input_output_size;
  }

  return inputs;
}